

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::DomeLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,DomeLight *light,
               string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  __type _Var2;
  Property *pPVar3;
  Attribute *this;
  AttrMeta *pAVar4;
  AttrMeta *pAVar5;
  size_type sVar6;
  mapped_type *this_00;
  ostream *poVar7;
  string *psVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  bool local_17b9;
  bool local_1791;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1728 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1708 [32];
  string local_16e8 [32];
  ostringstream local_16c8 [8];
  ostringstream ss_w_2;
  allocator local_1529;
  value_type local_1528 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1508;
  allocator local_14e1;
  string local_14e0;
  undefined1 local_14c0 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_1;
  Attribute *attr_2;
  allocator local_1481;
  value_type local_1480 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1460 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1440 [32];
  ostringstream local_1420 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a8;
  string local_1288;
  allocator local_1261;
  key_type local_1260 [4];
  _Base_ptr local_1240;
  undefined1 local_1238;
  allocator local_1229;
  value_type local_1228 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1208;
  allocator local_11e1;
  string local_11e0;
  undefined1 local_11c0 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr_1;
  allocator local_1181;
  value_type local_1180 [4];
  Attribute *local_1160;
  Attribute *attr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1138 [32];
  ostringstream local_1118 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa0;
  string local_f80;
  allocator local_f59;
  key_type local_f58 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f18 [39];
  allocator local_ef1;
  string local_ef0 [32];
  string local_ed0;
  ostringstream local_eb0 [8];
  ostringstream ss_e_5;
  allocator local_d31;
  string local_d30;
  string local_d10;
  undefined1 local_cf0 [8];
  ParseResult ret_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8 [39];
  allocator local_c81;
  string local_c80 [32];
  string local_c60;
  ostringstream local_c40 [8];
  ostringstream ss_e_4;
  allocator local_ac1;
  string local_ac0;
  string local_aa0;
  undefined1 local_a80 [8];
  ParseResult ret_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38 [39];
  allocator local_a11;
  string local_a10 [32];
  string local_9f0;
  ostringstream local_9d0 [8];
  ostringstream ss_e_3;
  allocator local_851;
  string local_850;
  string local_830;
  undefined1 local_810 [8];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8 [39];
  allocator local_7a1;
  string local_7a0 [32];
  string local_780;
  ostringstream local_760 [8];
  ostringstream ss_e_2;
  allocator local_5e1;
  string local_5e0;
  string local_5c0;
  undefined1 local_5a0 [8];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558 [39];
  allocator local_531;
  string local_530 [32];
  string local_510;
  ostringstream local_4f0 [8];
  ostringstream ss_e_1;
  allocator local_371;
  string local_370;
  string local_350;
  undefined1 local_330 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  string local_2a0;
  ostringstream local_280 [8];
  ostringstream ss_e;
  allocator local_101;
  string local_100;
  string local_e0;
  undefined1 local_c0 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  DomeLight *light_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  bVar1 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,
                     (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin(properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end(properties);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
      ret.err.field_2._8_8_ =
           ::std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
           ::operator*(&__end2);
      ::std::__cxx11::string::string((string *)&local_e0,(string *)ret.err.field_2._8_8_);
      pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_100,"guideRadius",&local_101);
      psVar8 = &local_100;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_c0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_e0,pPVar3,psVar8,&light->guideRadius);
      ::std::__cxx11::string::~string((string *)&local_100);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
      ::std::__cxx11::string::~string((string *)&local_e0);
      if ((local_c0._0_4_ == Success) || (local_c0._0_4_ == AlreadyProcessed)) {
        __range2._4_4_ = 3;
      }
      else if (local_c0._0_4_ == Unmatched) {
        __range2._4_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_280);
        poVar7 = ::std::operator<<((ostream *)local_280,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd3e);
        ::std::operator<<(poVar7," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2c0,"Parsing attribute `{}` failed. Error: {}",&local_2c1);
        fmt::format<char[12],std::__cxx11::string>
                  (&local_2a0,(fmt *)local_2c0,(string *)0x5f495b,(char (*) [12])&ret,psVar8);
        poVar7 = ::std::operator<<((ostream *)local_280,(string *)&local_2a0);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::~string((string *)&local_2a0);
        ::std::__cxx11::string::~string(local_2c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_2e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_1.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_2e8);
          ::std::__cxx11::string::~string((string *)local_2e8);
          ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        __range2._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_280);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_c0);
      if (__range2._4_4_ == 0) {
        ::std::__cxx11::string::string((string *)&local_350,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_370,"inputs:diffuse",&local_371);
        psVar8 = &local_370;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_330,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,&local_350,pPVar3,psVar8,&(light->super_NonboundableLight).diffuse);
        ::std::__cxx11::string::~string((string *)&local_370);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_371);
        ::std::__cxx11::string::~string((string *)&local_350);
        if ((local_330._0_4_ == Success) || (local_330._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_330._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_4f0);
          poVar7 = ::std::operator<<((ostream *)local_4f0,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd3f);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_530,"Parsing attribute `{}` failed. Error: {}",&local_531);
          fmt::format<char[15],std::__cxx11::string>
                    (&local_510,(fmt *)local_530,(string *)"inputs:diffuse",(char (*) [15])&ret_1,
                     psVar8);
          poVar7 = ::std::operator<<((ostream *)local_4f0,(string *)&local_510);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)&local_510);
          ::std::__cxx11::string::~string(local_530);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_531);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_558,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_2.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_558);
            ::std::__cxx11::string::~string((string *)local_558);
            ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_4f0);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_330);
        if (__range2._4_4_ != 0) goto joined_r0x002bc36f;
        ::std::__cxx11::string::string((string *)&local_5c0,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_5e0,"inputs:specular",&local_5e1);
        psVar8 = &local_5e0;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_5a0,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,&local_5c0,pPVar3,psVar8,&(light->super_NonboundableLight).specular);
        ::std::__cxx11::string::~string((string *)&local_5e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
        ::std::__cxx11::string::~string((string *)&local_5c0);
        if ((local_5a0._0_4_ == Success) || (local_5a0._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_5a0._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_760);
          poVar7 = ::std::operator<<((ostream *)local_760,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd41);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_7a0,"Parsing attribute `{}` failed. Error: {}",&local_7a1);
          fmt::format<char[16],std::__cxx11::string>
                    (&local_780,(fmt *)local_7a0,(string *)"inputs:specular",(char (*) [16])&ret_2,
                     psVar8);
          poVar7 = ::std::operator<<((ostream *)local_760,(string *)&local_780);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)&local_780);
          ::std::__cxx11::string::~string(local_7a0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_7c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_3.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_7c8);
            ::std::__cxx11::string::~string((string *)local_7c8);
            ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_760);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_5a0);
        if (__range2._4_4_ != 0) goto joined_r0x002bc36f;
        ::std::__cxx11::string::string((string *)&local_830,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_850,"inputs:colorTemperature",&local_851);
        psVar8 = &local_850;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_810,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,&local_830,pPVar3,psVar8,
                   &(light->super_NonboundableLight).colorTemperature);
        ::std::__cxx11::string::~string((string *)&local_850);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_851);
        ::std::__cxx11::string::~string((string *)&local_830);
        if ((local_810._0_4_ == Success) || (local_810._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_810._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_9d0);
          poVar7 = ::std::operator<<((ostream *)local_9d0,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd43);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_a10,"Parsing attribute `{}` failed. Error: {}",&local_a11);
          fmt::format<char[24],std::__cxx11::string>
                    (&local_9f0,(fmt *)local_a10,(string *)"inputs:colorTemperature",
                     (char (*) [24])&ret_3,psVar8);
          poVar7 = ::std::operator<<((ostream *)local_9d0,(string *)&local_9f0);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)&local_9f0);
          ::std::__cxx11::string::~string(local_a10);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_a11);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_a38,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_4.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_a38);
            ::std::__cxx11::string::~string((string *)local_a38);
            ::std::__cxx11::string::~string((string *)(ret_4.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_9d0);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_810);
        if (__range2._4_4_ != 0) goto joined_r0x002bc36f;
        ::std::__cxx11::string::string((string *)&local_aa0,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_ac0,"inputs:color",&local_ac1);
        psVar8 = &local_ac0;
        anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                  ((ParseResult *)local_a80,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,&local_aa0,pPVar3,psVar8,&(light->super_NonboundableLight).color);
        ::std::__cxx11::string::~string((string *)&local_ac0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
        ::std::__cxx11::string::~string((string *)&local_aa0);
        if ((local_a80._0_4_ == Success) || (local_a80._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_a80._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_c40);
          poVar7 = ::std::operator<<((ostream *)local_c40,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd44);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_c80,"Parsing attribute `{}` failed. Error: {}",&local_c81);
          fmt::format<char[13],std::__cxx11::string>
                    (&local_c60,(fmt *)local_c80,(string *)"inputs:color",(char (*) [13])&ret_4,
                     psVar8);
          poVar7 = ::std::operator<<((ostream *)local_c40,(string *)&local_c60);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)&local_c60);
          ::std::__cxx11::string::~string(local_c80);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_c81);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_ca8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (ret_5.err.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_ca8);
            ::std::__cxx11::string::~string((string *)local_ca8);
            ::std::__cxx11::string::~string((string *)(ret_5.err.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_c40);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_a80);
        if (__range2._4_4_ != 0) goto joined_r0x002bc36f;
        ::std::__cxx11::string::string((string *)&local_d10,(string *)ret.err.field_2._8_8_);
        pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_d30,"inputs:intensity",&local_d31);
        psVar8 = &local_d30;
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_cf0,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,&local_d10,pPVar3,psVar8,&(light->super_NonboundableLight).intensity)
        ;
        ::std::__cxx11::string::~string((string *)&local_d30);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_d31);
        ::std::__cxx11::string::~string((string *)&local_d10);
        if ((local_cf0._0_4_ == Success) || (local_cf0._0_4_ == AlreadyProcessed)) {
          __range2._4_4_ = 3;
        }
        else if (local_cf0._0_4_ == Unmatched) {
          __range2._4_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_eb0);
          poVar7 = ::std::operator<<((ostream *)local_eb0,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd46);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_ef0,"Parsing attribute `{}` failed. Error: {}",&local_ef1);
          fmt::format<char[17],std::__cxx11::string>
                    (&local_ed0,(fmt *)local_ef0,(string *)"inputs:intensity",(char (*) [17])&ret_5,
                     psVar8);
          poVar7 = ::std::operator<<((ostream *)local_eb0,(string *)&local_ed0);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)&local_ed0);
          ::std::__cxx11::string::~string(local_ef0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_ef1);
          if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_f18,local_f38);
            ::std::__cxx11::string::operator=
                      ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)local_f18);
            ::std::__cxx11::string::~string((string *)local_f18);
            ::std::__cxx11::string::~string((string *)local_f38);
          }
          spec_local._7_1_ = 0;
          __range2._4_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_eb0);
        }
        anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_cf0);
        if (__range2._4_4_ != 0) goto joined_r0x002bc36f;
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)ret.err.field_2._8_8_,"visibility");
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_f58,"visibility",&local_f59);
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,local_f58);
          ::std::__cxx11::string::~string((string *)local_f58);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_f59);
          if (sVar6 == 0) {
            Property::value_type_name_abi_cxx11_
                      (&local_f80,(Property *)(ret.err.field_2._8_8_ + 0x20));
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var2 = ::std::operator==(&local_f80,&local_fa0);
            local_1791 = false;
            if (_Var2) {
              bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              local_1791 = false;
              if (bVar1) {
                local_1791 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
              }
            }
            ::std::__cxx11::string::~string((string *)&local_fa0);
            ::std::__cxx11::string::~string((string *)&local_f80);
            if (local_1791 == false) {
              fun._M_invoker =
                   (_Invoker_type)
                   Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
              ::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                        ((function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
                          *)local_11c0,VisibilityEnumHandler);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_11e0,"visibility",&local_11e1);
              bVar1 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_1208,
                         (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_11c0);
              bVar1 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                (&local_11e0,(bool)(bVar1 & 1),&local_1208,
                                 (Attribute *)fun._M_invoker,
                                 &(light->super_NonboundableLight).visibility,warn,
                                 (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function(&local_1208);
              ::std::__cxx11::string::~string((string *)&local_11e0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_11e1);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                pAVar4 = Attribute::metas((Attribute *)fun._M_invoker);
                pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::
                         metas(&(light->super_NonboundableLight).visibility);
                AttrMetas::operator=(pAVar5,pAVar4);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)local_1228,"visibility",&local_1229);
                pVar9 = ::std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_70,local_1228);
                local_1240 = (_Base_ptr)pVar9.first._M_node;
                local_1238 = pVar9.second;
                ::std::__cxx11::string::~string((string *)local_1228);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1229);
                __range2._4_4_ = 3;
              }
              else {
                spec_local._7_1_ = 0;
                __range2._4_4_ = 1;
              }
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)local_11c0);
              goto joined_r0x002bc36f;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_1118);
            poVar7 = ::std::operator<<((ostream *)local_1118,"[warn]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd48);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_1118,"No value assigned to `");
            poVar7 = ::std::operator<<(poVar7,"visibility");
            poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
            ::std::operator<<(poVar7,"\n");
            if (warn != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_1138,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &attr);
              ::std::__cxx11::string::operator=((string *)warn,(string *)local_1138);
              ::std::__cxx11::string::~string((string *)local_1138);
              ::std::__cxx11::string::~string((string *)&attr);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_1118);
            local_1160 = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
            pAVar4 = Attribute::metas(local_1160);
            pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::metas
                               (&(light->super_NonboundableLight).visibility);
            AttrMetas::operator=(pAVar5,pAVar4);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_1180,"visibility",&local_1181);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70,local_1180);
            ::std::__cxx11::string::~string((string *)local_1180);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1181);
          }
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ret.err.field_2._8_8_,"purpose");
          if (bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_1260,"purpose",&local_1261);
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,local_1260);
            ::std::__cxx11::string::~string((string *)local_1260);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1261);
            if (sVar6 == 0) {
              Property::value_type_name_abi_cxx11_
                        (&local_1288,(Property *)(ret.err.field_2._8_8_ + 0x20));
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var2 = ::std::operator==(&local_1288,&local_12a8);
              local_17b9 = false;
              if (_Var2) {
                bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                local_17b9 = false;
                if (bVar1) {
                  local_17b9 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
                }
              }
              ::std::__cxx11::string::~string((string *)&local_12a8);
              ::std::__cxx11::string::~string((string *)&local_1288);
              if (local_17b9 == false) {
                fun_1._M_invoker =
                     (_Invoker_type)
                     Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
                ::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                          ((function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
                            *)local_14c0,PurposeEnumHandler);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)&local_14e0,"purpose",&local_14e1);
                bVar1 = options->strict_allowedToken_check;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function(&local_1508,
                           (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)local_14c0);
                bVar1 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                  (&local_14e0,(bool)(bVar1 & 1),&local_1508,
                                   (Attribute *)fun_1._M_invoker,
                                   &(light->super_NonboundableLight).purpose,warn,
                                   (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count)
                ;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function(&local_1508);
                ::std::__cxx11::string::~string((string *)&local_14e0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_14e1);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  pAVar4 = Attribute::metas((Attribute *)fun_1._M_invoker);
                  pAVar5 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas
                                     (&(light->super_NonboundableLight).purpose);
                  AttrMetas::operator=(pAVar5,pAVar4);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)local_1528,"purpose",&local_1529);
                  ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_70,local_1528);
                  ::std::__cxx11::string::~string((string *)local_1528);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_1529);
                  __range2._4_4_ = 3;
                }
                else {
                  spec_local._7_1_ = 0;
                  __range2._4_4_ = 1;
                }
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)local_14c0);
                goto joined_r0x002bc36f;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_1420);
              poVar7 = ::std::operator<<((ostream *)local_1420,"[warn]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd4a);
              ::std::operator<<(poVar7," ");
              poVar7 = ::std::operator<<((ostream *)local_1420,"No value assigned to `");
              poVar7 = ::std::operator<<(poVar7,"purpose");
              poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
              ::std::operator<<(poVar7,"\n");
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_1440,local_1460);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_1440);
                ::std::__cxx11::string::~string((string *)local_1440);
                ::std::__cxx11::string::~string((string *)local_1460);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_1420);
              this = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              pAVar4 = Attribute::metas(this);
              pAVar5 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas
                                 (&(light->super_NonboundableLight).purpose);
              AttrMetas::operator=(pAVar5,pAVar4);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_1480,"purpose",&local_1481);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,local_1480);
              ::std::__cxx11::string::~string((string *)local_1480);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1481);
            }
          }
          else {
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,(key_type *)ret.err.field_2._8_8_);
            if (sVar6 == 0) {
              pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
              this_00 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](&(light->super_NonboundableLight).props,
                                     (key_type *)ret.err.field_2._8_8_);
              Property::operator=(this_00,pPVar3);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,(value_type *)ret.err.field_2._8_8_);
            }
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,(key_type *)ret.err.field_2._8_8_);
            if (sVar6 == 0) {
              ::std::__cxx11::ostringstream::ostringstream(local_16c8);
              poVar7 = ::std::operator<<((ostream *)local_16c8,"[warn]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd4c);
              ::std::operator<<(poVar7," ");
              ::std::operator+((char *)local_16e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Unsupported/unimplemented property: ");
              poVar7 = ::std::operator<<((ostream *)local_16c8,local_16e8);
              ::std::operator<<(poVar7,"\n");
              ::std::__cxx11::string::~string(local_16e8);
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_1708,local_1728);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_1708);
                ::std::__cxx11::string::~string((string *)local_1708);
                ::std::__cxx11::string::~string((string *)local_1728);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_16c8);
            }
          }
        }
      }
      else {
joined_r0x002bc36f:
        if (__range2._4_4_ != 3) goto LAB_002bc9de;
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    spec_local._7_1_ = 1;
  }
  else {
    spec_local._7_1_ = 0;
  }
LAB_002bc9de:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<DomeLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    DomeLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "guideRadius", DomeLight, light->guideRadius)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:diffuse", DomeLight, light->diffuse)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:specular", DomeLight,
                   light->specular)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:colorTemperature", DomeLight,
                   light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:color", DomeLight, light->color)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:intensity", DomeLight,
                   light->intensity)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, DomeLight,
                   light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, DomeLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, DomeLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  DCOUT("Implement DomeLight");
  return true;
}